

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O3

float128 float128_silence_nan_mips(float128 a,float_status *status)

{
  float128 fVar2;
  ulong uVar1;
  
  fVar2.low = -(ulong)(status->snan_bit_is_one != '\0') | a.low;
  uVar1 = 0x7fff7fffffffffff;
  if (status->snan_bit_is_one == '\0') {
    uVar1 = a.high | 0x800000000000;
  }
  fVar2.high = uVar1;
  return fVar2;
}

Assistant:

float128 float128_silence_nan(float128 a, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    g_assert_not_reached();
#else
    if (snan_bit_is_one(status)) {
        return float128_default_nan(status);
    } else {
        a.high |= UINT64_C(0x0000800000000000);
        return a;
    }
#endif
}